

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O3

void __thiscall Memory::HeapBlockMap32::ResetDirtyPages(HeapBlockMap32 *this,Recycler *recycler)

{
  HeapBlockType HVar1;
  L2MapChunk *pLVar2;
  HeapBlock *pHVar3;
  PageAllocatorBaseCommon *pPVar4;
  size_t sVar5;
  code *pcVar6;
  bool bVar7;
  int iVar8;
  undefined4 *puVar9;
  undefined4 extraout_var;
  IdleDecommitPageAllocator *pIVar10;
  char *pcVar11;
  long lVar12;
  Segment *pSVar13;
  char *address;
  IdleDecommitPageAllocator *pIVar14;
  char *pcVar15;
  Segment *pSVar16;
  char *pcVar17;
  long lVar18;
  HeapInfo *this_00;
  
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  lVar12 = 0;
  pSVar13 = (Segment *)0x0;
  do {
    pLVar2 = this->map[lVar12];
    if (pLVar2 != (L2MapChunk *)0x0) {
      lVar18 = 0;
      pSVar16 = pSVar13;
      do {
        pHVar3 = pLVar2->map[lVar18];
        pSVar13 = pSVar16;
        if (pHVar3 != (HeapBlock *)0x0) {
          pSVar13 = pHVar3->segment;
          if (pSVar13 == (Segment *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                               ,0x240,"(block->GetSegment() != nullptr)",
                               "block->GetSegment() != nullptr");
            if (!bVar7) goto LAB_006b4b9a;
            *puVar9 = 0;
            pSVar13 = pHVar3->segment;
          }
          if (pSVar13 == pSVar16) {
            if (pSVar16 == (Segment *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x243,"(currentSegment != nullptr)","currentSegment != nullptr");
              if (!bVar7) goto LAB_006b4b9a;
              *puVar9 = 0;
            }
            if ((pHVar3->address < pSVar16->address) ||
               (pSVar13 = pSVar16,
               pSVar16->address +
               (pSVar16->segmentPageCount - (ulong)pSVar16->secondaryAllocPageCount) * 0x1000 <=
               pHVar3->address)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x244,"(currentSegment->IsInSegment(block->GetAddress()))",
                                 "currentSegment->IsInSegment(block->GetAddress())");
              if (!bVar7) goto LAB_006b4b9a;
              *puVar9 = 0;
              pSVar13 = pSVar16;
            }
          }
          else {
            if (pSVar16 != (Segment *)0x0) {
              if ((pSVar16->address <= pHVar3->address) &&
                 (pHVar3->address <
                  pSVar16->address +
                  (pSVar16->segmentPageCount - (ulong)pSVar16->secondaryAllocPageCount) * 0x1000)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar9 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                   ,0x249,
                                   "(currentSegment == nullptr || !currentSegment->IsInSegment(block->GetAddress()))"
                                   ,
                                   "currentSegment == nullptr || !currentSegment->IsInSegment(block->GetAddress())"
                                  );
                if (!bVar7) goto LAB_006b4b9a;
                *puVar9 = 0;
                pSVar13 = pHVar3->segment;
              }
            }
            if (pSVar13 == (Segment *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x24b,"(currentSegment != nullptr)","currentSegment != nullptr");
              if (!bVar7) goto LAB_006b4b9a;
              *puVar9 = 0;
            }
            pPVar4 = (pSVar13->super_SegmentBaseCommon).allocator;
            address = pSVar13->address;
            sVar5 = pSVar13->segmentPageCount;
            pIVar14 = (IdleDecommitPageAllocator *)&pPVar4[-1].allocatorType;
            if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
              pIVar14 = (IdleDecommitPageAllocator *)0x0;
            }
            iVar8 = (*pHVar3->_vptr_HeapBlock[5])(pHVar3);
            this_00 = (HeapInfo *)CONCAT44(extraout_var,iVar8);
            HVar1 = pHVar3->heapBlockType;
            if (HVar1 < 0xc) {
              if ((0x630U >> (HVar1 & 0x1f) & 1) == 0) {
                if ((0x84U >> (HVar1 & 0x1f) & 1) == 0) {
                  if (HVar1 != 0xb) goto LAB_006b4a06;
                  pIVar10 = HeapInfo::GetRecyclerLargeBlockPageAllocator(this_00);
                }
                else {
                  pIVar10 = HeapInfo::GetRecyclerLeafPageAllocator(this_00);
                }
              }
              else {
                pIVar10 = HeapInfo::GetRecyclerWithBarrierPageAllocator(this_00);
              }
            }
            else {
LAB_006b4a06:
              pIVar10 = HeapInfo::GetRecyclerPageAllocator(this_00);
            }
            if (pIVar14 != pIVar10) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x251,
                                 "(segmentPageAllocator == block->GetPageAllocator(block->GetHeapInfo()))"
                                 ,
                                 "segmentPageAllocator == block->GetPageAllocator(block->GetHeapInfo())"
                                );
              if (!bVar7) goto LAB_006b4b9a;
              *puVar9 = 0;
            }
            pcVar17 = (char *)(sVar5 * 0x1000);
            pcVar11 = this->startAddress;
            if (address < pcVar11) {
              if (pcVar17 <= pcVar11 + -(long)address) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar9 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                   ,600,
                                   "(segmentLength > (size_t)(this->startAddress - segmentStart))",
                                   "segmentLength > (size_t)(this->startAddress - segmentStart)");
                if (!bVar7) goto LAB_006b4b9a;
                *puVar9 = 0;
                pcVar11 = this->startAddress;
              }
              pcVar17 = address + ((long)pcVar17 - (long)pcVar11);
              address = pcVar11;
            }
            pcVar15 = (char *)(0x100000000 - ((long)address - (long)pcVar11));
            if (pcVar17 + ((long)address - (long)pcVar11) < (char *)0x100000001) {
              pcVar15 = pcVar17;
            }
            if (((ulong)pcVar15 & 0xfff) != 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x26e,"(segmentLength % AutoSystemInfo::PageSize == 0)",
                                 "segmentLength % AutoSystemInfo::PageSize == 0");
              if (!bVar7) {
LAB_006b4b9a:
                pcVar6 = (code *)invalidInstructionException();
                (*pcVar6)();
              }
              *puVar9 = 0;
            }
            if ((pSVar13->field_0x2c & 2) != 0) {
              RecyclerWriteBarrierManager::ResetWriteBarrier(address,(ulong)pcVar15 >> 0xc);
            }
          }
        }
        lVar18 = lVar18 + 1;
        pSVar16 = pSVar13;
      } while (lVar18 != 0x100);
    }
    lVar12 = lVar12 + 1;
    if (lVar12 == 0x1000) {
      return;
    }
  } while( true );
}

Assistant:

void
HeapBlockMap32::ResetDirtyPages(Recycler * recycler)
{
    this->ForEachSegment(recycler, [=](char * segmentStart, size_t segmentLength, Segment * segment, PageAllocator * segmentPageAllocator) {

        Assert(segmentLength % AutoSystemInfo::PageSize == 0);

#ifdef RECYCLER_WRITE_WATCH
        if (!CONFIG_FLAG(ForceSoftwareWriteBarrier))
        {
            if (segmentPageAllocator->IsWriteWatchEnabled())
            {
                // Call ResetWriteWatch for Small non-leaf and Large segments.
                UINT ret = ::ResetWriteWatch(segmentStart, segmentLength);
                Assert(ret == 0);
            }
        }
#endif

#ifdef RECYCLER_WRITE_BARRIER
#if defined(TARGET_64)
        if (segment->IsWriteBarrierEnabled())
#endif
        {
            // Reset software write barrier for barrier segments.
            RecyclerWriteBarrierManager::ResetWriteBarrier(segmentStart, segmentLength / AutoSystemInfo::PageSize);
        }
#endif
    });
}